

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<args::EitherFlag> in;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Station *this;
  Station *pSVar3;
  reference pvVar4;
  reference ppSVar5;
  EvaluationFunction *this_00;
  Plan *p;
  ostream *poVar6;
  void *pvVar7;
  pair<int,_const_char_*> pVar8;
  int i_4;
  double eval;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double ratio;
  double intensity;
  bool sign;
  int beamlet;
  Station *s;
  iterator it;
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  sb;
  int i_3;
  double best_eval;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  vector<double,_std::allocator<double>_> w;
  int i_2;
  Plan P;
  EvaluationFunction *F;
  int i_1;
  Station *station;
  vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  int i;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  Collimator collimator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  organ_files;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  coord_files;
  string file;
  Help *anon_var_0;
  ParseError *e;
  ValidationError *e_1;
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  HelpFlag help;
  ArgumentParser parser;
  undefined4 in_stack_fffffffffffff328;
  undefined4 in_stack_fffffffffffff32c;
  undefined4 in_stack_fffffffffffff330;
  undefined4 in_stack_fffffffffffff334;
  undefined4 in_stack_fffffffffffff338;
  undefined4 in_stack_fffffffffffff33c;
  undefined4 in_stack_fffffffffffff340;
  undefined4 in_stack_fffffffffffff344;
  Group *in_stack_fffffffffffff348;
  string *in_stack_fffffffffffff350;
  Group *in_stack_fffffffffffff358;
  Station *in_stack_fffffffffffff360;
  iterator in_stack_fffffffffffff368;
  Station *in_stack_fffffffffffff370;
  Collimator *in_stack_fffffffffffff378;
  EvaluationFunction *in_stack_fffffffffffff380;
  EvaluationFunction *this_01;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff388;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff390;
  Plan *in_stack_fffffffffffff398;
  ArgumentParser *in_stack_fffffffffffff3a0;
  value_type in_stack_fffffffffffff3d0;
  value_type in_stack_fffffffffffff3d8;
  undefined1 *puVar9;
  string *in_stack_fffffffffffff400;
  allocator *paVar10;
  string *in_stack_fffffffffffff408;
  undefined4 in_stack_fffffffffffff410;
  undefined4 in_stack_fffffffffffff414;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffff478;
  undefined4 in_stack_fffffffffffff480;
  int in_stack_fffffffffffff484;
  int in_stack_fffffffffffff488;
  int in_stack_fffffffffffff48c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff490;
  Collimator *in_stack_fffffffffffff498;
  EvaluationFunction *this_02;
  allocator *paVar11;
  _Hash_node_base *p_Var12;
  _Hash_node_base *p_Var13;
  _Hash_node_base *p_Var14;
  allocator *myfile;
  int local_b0c;
  int in_stack_fffffffffffff504;
  int in_stack_fffffffffffff508;
  int in_stack_fffffffffffff50c;
  Plan *in_stack_fffffffffffff510;
  EvaluationFunction *in_stack_fffffffffffff518;
  vector<double,_std::allocator<double>_> local_ac0 [2];
  int local_a8c;
  EvaluationFunction *local_a88;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 *local_a58;
  undefined8 local_a50;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 *local_a08;
  undefined8 local_a00;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 *local_9b8;
  undefined8 local_9b0;
  int local_98c;
  EvaluationFunction *local_8b8;
  int local_8ac;
  value_type local_8a8;
  undefined1 local_899;
  vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_898;
  string local_880 [100];
  int local_81c;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff8b8;
  Collimator *in_stack_fffffffffffff8c0;
  EvaluationFunction *in_stack_fffffffffffff8e0;
  allocator local_641;
  string local_640 [39];
  allocator local_619;
  string local_618 [39];
  allocator local_5f1;
  string local_5f0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d0;
  undefined4 local_5b4;
  int local_5b0;
  char *local_5a8;
  undefined4 local_59c;
  int local_598;
  char *local_590;
  undefined4 local_584;
  int local_580;
  char *local_578;
  undefined4 local_56c;
  int local_568;
  char *local_560;
  undefined4 local_554;
  int local_550;
  char *local_548;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_538;
  string local_520 [52];
  undefined4 local_4ec;
  undefined1 local_4e0 [40];
  string local_4b8 [39];
  allocator local_491;
  string local_490 [32];
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_470;
  __node_base local_3f0;
  _Hash_node_base local_3e8 [5];
  _Hash_node_base local_3c0 [5];
  _Hash_node_base local_398;
  pointer local_390;
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [239];
  allocator local_1f9;
  string local_1f8 [55];
  allocator local_1c1;
  string local_1c0 [444];
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"********* IMRT-Solver *********",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"An IMRT Solver.",&local_1f9);
  args::ArgumentParser::ArgumentParser
            ((ArgumentParser *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
             in_stack_fffffffffffff408,in_stack_fffffffffffff400);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"help",&local_2e9);
  myfile = &local_311;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"Display this help menu",myfile);
  local_3f0._M_nxt = local_3e8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
             (char)((uint)in_stack_fffffffffffff32c >> 0x18));
  local_3f0._M_nxt = local_3c0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_fffffffffffff360,(char *)in_stack_fffffffffffff358);
  local_398._M_nxt = local_3e8;
  local_390 = (pointer)0x2;
  in._M_len = (size_type)in_stack_fffffffffffff370;
  in._M_array = in_stack_fffffffffffff368;
  args::Matcher::Matcher((Matcher *)in_stack_fffffffffffff360,in);
  args::HelpFlag::HelpFlag
            ((HelpFlag *)in_stack_fffffffffffff350,in_stack_fffffffffffff348,
             (string *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
             (string *)CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338),
             (Matcher *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
  p_Var13 = local_3e8;
  p_Var12 = &local_398;
  do {
    p_Var12 = p_Var12 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x106506);
  } while (p_Var12 != p_Var13);
  p_Var14 = p_Var12;
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  paVar11 = &local_491;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"instance",paVar11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"Instance",(allocator *)(local_4e0 + 0x27));
  this_02 = (EvaluationFunction *)local_4e0;
  std::__cxx11::string::string((string *)this_02);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Positional((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350,
               (string *)in_stack_fffffffffffff348,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  std::__cxx11::string::~string((string *)local_4e0);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)(local_4e0 + 0x27));
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  args::ArgumentParser::ParseCLI
            (in_stack_fffffffffffff3a0,(int)((ulong)in_stack_fffffffffffff398 >> 0x20),
             (char **)in_stack_fffffffffffff390);
  pbVar2 = args::
           Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::Get(&local_470);
  std::__cxx11::string::string(local_520,(string *)pbVar2);
  std::
  allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x106b33);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffff350,(size_type)in_stack_fffffffffffff348,
           (allocator_type *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  std::
  allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x106b5c);
  local_554 = 0;
  pVar8 = std::make_pair<int,char_const(&)[41]>
                    ((int *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                     (char (*) [41])CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_548 = pVar8.second;
  local_550 = pVar8.first;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&local_538,0);
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
             (pair<int,_const_char_*> *)
             CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_56c = 0x46;
  pVar8 = std::make_pair<int,char_const(&)[42]>
                    ((int *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                     (char (*) [42])CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_560 = pVar8.second;
  local_568 = pVar8.first;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&local_538,1);
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
             (pair<int,_const_char_*> *)
             CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_584 = 0x8c;
  pVar8 = std::make_pair<int,char_const(&)[43]>
                    ((int *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                     (char (*) [43])CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_578 = pVar8.second;
  local_580 = pVar8.first;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&local_538,2);
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
             (pair<int,_const_char_*> *)
             CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_59c = 0xd2;
  pVar8 = std::make_pair<int,char_const(&)[43]>
                    ((int *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                     (char (*) [43])CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_590 = pVar8.second;
  local_598 = pVar8.first;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&local_538,3);
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
             (pair<int,_const_char_*> *)
             CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_5b4 = 0x118;
  pVar8 = std::make_pair<int,char_const(&)[43]>
                    ((int *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                     (char (*) [43])CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  local_5a8 = pVar8.second;
  local_5b0 = pVar8.first;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&local_538,4);
  std::pair<int,std::__cxx11::string>::operator=
            ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
             (pair<int,_const_char_*> *)
             CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x106da2);
  paVar10 = &local_5f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f0,"data/CERR_Prostate/DAO_DDM_BLADDER.dat",paVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
              (value_type *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"data/CERR_Prostate/DAO_DDM_RECTUM.dat",&local_619);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
              (value_type *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"data/CERR_Prostate/DAO_DDM_PTVHD.dat",&local_641);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
              (value_type *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  imrt::Collimator::Collimator(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::vector
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)0x106ef2);
  local_81c = 0;
  while( true ) {
    this = (Station *)(long)local_81c;
    pSVar3 = (Station *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&local_5d0);
    if (pSVar3 <= this) break;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_5d0,(long)local_81c);
    std::__cxx11::string::string(local_880,(string *)pvVar4);
    imrt::Volume::Volume
              ((Volume *)in_stack_fffffffffffff380,in_stack_fffffffffffff378,
               (string *)in_stack_fffffffffffff370);
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::push_back
              ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)
               CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
               (value_type *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
    imrt::Volume::~Volume((Volume *)0x106f98);
    std::__cxx11::string::~string(local_880);
    local_81c = local_81c + 1;
  }
  puVar9 = &local_899;
  std::allocator<imrt::Station_*>::allocator((allocator<imrt::Station_*> *)0x107165);
  std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::vector
            ((vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)in_stack_fffffffffffff350,
             (size_type)in_stack_fffffffffffff348,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  std::allocator<imrt::Station_*>::~allocator((allocator<imrt::Station_*> *)0x10718e);
  for (local_8ac = 0; local_8ac < 5; local_8ac = local_8ac + 1) {
    in_stack_fffffffffffff3d8 = (value_type)operator_new(0x170);
    in_stack_fffffffffffff348 = (Group *)0x0;
    in_stack_fffffffffffff340 = 6;
    in_stack_fffffffffffff338 = 0xffffffff;
    in_stack_fffffffffffff330 = 2;
    in_stack_fffffffffffff328 = 0;
    imrt::Station::Station
              ((Station *)this_02,in_stack_fffffffffffff498,
               (vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)in_stack_fffffffffffff490,
               in_stack_fffffffffffff48c,in_stack_fffffffffffff488,in_stack_fffffffffffff484,
               (int)paVar11,(int)p_Var12,(int)p_Var13,(int)p_Var14,(fstream *)myfile);
    local_8a8 = in_stack_fffffffffffff3d8;
    imrt::Station::generateIntensity(in_stack_fffffffffffff360);
    imrt::Station::printIntensity
              (in_stack_fffffffffffff360,SUB81((ulong)in_stack_fffffffffffff358 >> 0x38,0));
    in_stack_fffffffffffff3d0 = local_8a8;
    ppSVar5 = std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::operator[]
                        (&local_898,(long)local_8ac);
    *ppSVar5 = in_stack_fffffffffffff3d0;
  }
  local_8b8 = imrt::EvaluationFunction::getInstance
                        ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)
                         CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
                         (Collimator *)CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338)
                        );
  imrt::Plan::Plan((Plan *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                   (EvaluationFunction *)
                   CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  for (local_98c = 0; local_98c < 5; local_98c = local_98c + 1) {
    std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::operator[]
              (&local_898,(long)local_98c);
    imrt::Plan::add_station
              ((Plan *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
               (Station *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  }
  local_9d8 = 0x3ff0000000000000;
  uStack_9d0 = 0x3ff0000000000000;
  local_9c8 = 0x3ff0000000000000;
  local_9b8 = &local_9d8;
  local_9b0 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x1073f3);
  __l._M_len = (size_type)in_stack_fffffffffffff370;
  __l._M_array = (iterator)in_stack_fffffffffffff368;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff360,__l,
             (allocator_type *)in_stack_fffffffffffff358);
  std::allocator<double>::~allocator((allocator<double> *)0x107427);
  local_a18 = 0x4051800000000000;
  local_a28 = 0;
  uStack_a20 = 0;
  local_a08 = &local_a28;
  local_a00 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x107479);
  __l_00._M_len = (size_type)in_stack_fffffffffffff370;
  __l_00._M_array = (iterator)in_stack_fffffffffffff368;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff360,__l_00,
             (allocator_type *)in_stack_fffffffffffff358);
  std::allocator<double>::~allocator((allocator<double> *)0x1074ad);
  local_a68 = 0x408f400000000000;
  local_a78 = 0x4049000000000000;
  uStack_a70 = 0x4049000000000000;
  local_a58 = &local_a78;
  local_a50 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x1074ff);
  __l_01._M_len = (size_type)in_stack_fffffffffffff370;
  __l_01._M_array = (iterator)in_stack_fffffffffffff368;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff360,__l_01,
             (allocator_type *)in_stack_fffffffffffff358);
  std::allocator<double>::~allocator((allocator<double> *)0x107533);
  local_a88 = (EvaluationFunction *)
              imrt::EvaluationFunction::eval
                        ((EvaluationFunction *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                         in_stack_fffffffffffff390,in_stack_fffffffffffff388,
                         (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff380);
  this_00 = (EvaluationFunction *)std::operator<<((ostream *)&std::cout,"ev:");
  p = (Plan *)std::ostream::operator<<(this_00,(double)local_a88);
  std::ostream::operator<<(p,std::endl<char,std::char_traits<char>>);
  for (local_a8c = 0; local_a8c < 100; local_a8c = local_a8c + 1) {
    imrt::EvaluationFunction::best_beamlets
              (in_stack_fffffffffffff518,in_stack_fffffffffffff510,in_stack_fffffffffffff50c,
               in_stack_fffffffffffff508,in_stack_fffffffffffff504);
    in_stack_fffffffffffff388 = local_ac0;
    std::
    set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
    ::begin((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
    iVar1 = rand();
    in_stack_fffffffffffff390 = (vector<double,_std::allocator<double>_> *)(long)iVar1;
    std::
    set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
    ::size((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
            *)0x107638);
    std::
    advance<std::_Rb_tree_const_iterator<std::pair<std::pair<double,bool>,std::pair<imrt::Station*,int>>>,unsigned_long>
              ((_Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
                *)in_stack_fffffffffffff350,(unsigned_long)in_stack_fffffffffffff348);
    std::
    _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>::
    operator->((_Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
                *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
    std::
    _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>::
    operator->((_Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
                *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
    std::
    _Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>::
    operator->((_Rb_tree_const_iterator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>
                *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
    rand();
    iVar1 = rand();
    in_stack_fffffffffffff518 = (EvaluationFunction *)(double)(iVar1 % 5);
    imrt::Station::increaseIntensity_abi_cxx11_
              (this,(int)((ulong)puVar9 >> 0x20),(double)in_stack_fffffffffffff3d8,
               (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
    this_01 = (EvaluationFunction *)
              imrt::EvaluationFunction::incremental_eval
                        (this_02,(Station *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488),
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                         in_stack_fffffffffffff478);
    if ((double)this_01 <= (double)local_a88) {
      in_stack_fffffffffffff380 = this_01;
      in_stack_fffffffffffff378 = (Collimator *)std::ostream::operator<<(&std::cout,(double)this_01)
      ;
      std::ostream::operator<<(in_stack_fffffffffffff378,std::endl<char,std::char_traits<char>>);
      local_a88 = this_01;
    }
    else {
      imrt::Station::revert
                (in_stack_fffffffffffff370,
                 (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 in_stack_fffffffffffff368);
      imrt::EvaluationFunction::undo_last_eval
                (this_01,(vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff378,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff370,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff368);
      in_stack_fffffffffffff380 = this_01;
    }
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x1078fc);
    std::
    set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
    ::~set((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
            *)0x107909);
  }
  for (local_b0c = 0; local_b0c < 5; local_b0c = local_b0c + 1) {
    std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::operator[]
              (&local_898,(long)local_b0c);
    imrt::Station::printIntensity
              (in_stack_fffffffffffff360,SUB81((ulong)in_stack_fffffffffffff358 >> 0x38,0));
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"best_eval:");
  pvVar7 = (void *)std::ostream::operator<<(poVar6,(double)local_a88);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  local_a88 = (EvaluationFunction *)
              imrt::EvaluationFunction::eval
                        (this_00,p,in_stack_fffffffffffff390,in_stack_fffffffffffff388,
                         (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff380);
  poVar6 = std::operator<<((ostream *)&std::cout,"ev:");
  pvVar7 = (void *)std::ostream::operator<<(poVar6,(double)local_a88);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  imrt::EvaluationFunction::generate_voxel_dose_functions(in_stack_fffffffffffff8e0);
  system("python plotter/plot.py");
  local_4 = 0;
  local_4ec = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  imrt::Plan::~Plan((Plan *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
  std::vector<imrt::Station_*,_std::allocator<imrt::Station_*>_>::~vector
            ((vector<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
             CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)
             CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  imrt::Collimator::~Collimator
            ((Collimator *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340));
  std::__cxx11::string::~string(local_520);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Positional((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
  args::HelpFlag::~HelpFlag((HelpFlag *)0x107ba6);
  args::ArgumentParser::~ArgumentParser
            ((ArgumentParser *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
  return local_4;
}

Assistant:

int main(int argc, char** argv){

	args::ArgumentParser parser("********* IMRT-Solver *********", "An IMRT Solver.");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
	//args::ValueFlag<double> _min_fr(parser, "double", "Minimum volume occupied by a block (proportion)", {"min_fr"});
	//args::Flag trace(parser, "trace", "Trace", {"trace"});
	args::Positional<std::string> _file(parser, "instance", "Instance");

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

	string file=_file.Get();

	vector< pair<int, string> > coord_files(5);
	coord_files[0]=(make_pair(0,"data/CERR_Prostate/CoordinatesBeam_0.txt"));
	coord_files[1]=(make_pair(70,"data/CERR_Prostate/CoordinatesBeam_70.txt"));
	coord_files[2]=(make_pair(140,"data/CERR_Prostate/CoordinatesBeam_140.txt"));
	coord_files[3]=(make_pair(210,"data/CERR_Prostate/CoordinatesBeam_210.txt"));
	coord_files[4]=(make_pair(280,"data/CERR_Prostate/CoordinatesBeam_280.txt"));

	vector<string> organ_files;
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_BLADDER.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_RECTUM.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_PTVHD.dat");

  	Collimator collimator(coord_files);
  //	collimator.printAxisValues();
  //	collimator.printActiveBeam();

	vector<Volume> volumes;

  for (int i=0; i<organ_files.size(); i++) {
	  volumes.push_back(Volume(collimator, organ_files[i]));
	}

   //volumes[0].print_deposition();

   vector<Station*> stations(5);
   Station* station;
   for(int i=0;i<5;i++){
	   station = new Station(collimator,volumes, i*70, 4);
	   station->generateIntensity();
	   station->printIntensity();
	   stations[i]=station;
   }

   EvaluationFunction& F = EvaluationFunction::getInstance(volumes,collimator);
   Plan P(F);
   for(int i=0;i<5;i++)
	   P.add_station(*stations[i]);


	vector<double> w={1,1,1};
	vector<double> Zmin={0,0,70};
	vector<double> Zmax={50,50,1000};

	double best_eval=F.eval(P,w,Zmin,Zmax);
	cout << "ev:" << best_eval << endl;

	for(int i=0;i<100;i++){
		auto sb=F.best_beamlets(P, 10, 10);
		auto it=sb.begin();
		std::advance(it,rand()%sb.size());

		Station*s = it->second.first; int beamlet=it->second.second;
		bool sign=it->first.second;

		//cout << eval_beamlet << endl;

		double intensity=rand()%3;
		if(sign) intensity*=-1;

		double ratio= rand()%5 ;
		//if(eval_beamlet<0) intensity=-intensity;


		auto diff=s->increaseIntensity(beamlet,intensity,ratio);
		double eval=F.incremental_eval(*s,w,Zmin,Zmax, diff);

		if(eval > best_eval){ //reject the move
			s->revert(diff);
			F.undo_last_eval(w,Zmin,Zmax);
		}else{ //accept the move
			cout << eval << endl;
			best_eval=eval;
		}
	}

	for(int i=0;i<5;i++)
		stations[i]->printIntensity();

	cout << "best_eval:" << best_eval << endl;

	best_eval=F.eval(P,w,Zmin,Zmax);
		cout << "ev:" << best_eval << endl;

  F.generate_voxel_dose_functions ();
  system("python plotter/plot.py");

	return 0;

}